

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O3

void asmjit::v1_14::x86::assignEmitterFuncs(BaseEmitter *emitter)

{
  code *pcVar1;
  
  (emitter->_funcs).emitProlog = Emitter_emitProlog;
  (emitter->_funcs).emitEpilog = Emitter_emitEpilog;
  (emitter->_funcs).emitArgsAssignment = Emitter_emitArgsAssignment;
  (emitter->_funcs).formatInstruction = FormatterInternal::formatInstruction;
  if (((emitter->_environment)._arch & k32BitMask) == kUnknown) {
    pcVar1 = InstInternal::validateX64;
  }
  else {
    pcVar1 = InstInternal::validateX86;
  }
  (emitter->_funcs).validate = pcVar1;
  return;
}

Assistant:

void assignEmitterFuncs(BaseEmitter* emitter) {
  emitter->_funcs.emitProlog = Emitter_emitProlog;
  emitter->_funcs.emitEpilog = Emitter_emitEpilog;
  emitter->_funcs.emitArgsAssignment = Emitter_emitArgsAssignment;

#ifndef ASMJIT_NO_LOGGING
  emitter->_funcs.formatInstruction = FormatterInternal::formatInstruction;
#endif

#ifndef ASMJIT_NO_VALIDATION
  emitter->_funcs.validate = emitter->is32Bit() ? InstInternal::validateX86 : InstInternal::validateX64;
#endif
}